

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O1

void __thiscall nuraft::snapshot_io_mgr::async_io_loop(snapshot_io_mgr *this)

{
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *this_00;
  size_t *psVar1;
  atomic<bool> *paVar2;
  uint uVar3;
  int32 iVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  ulong uVar10;
  ulong uVar11;
  long *plVar12;
  __atomic_base<unsigned_long> _Var13;
  raft_server *prVar14;
  ulong uVar15;
  __node_base_ptr p_Var16;
  _Hash_node_base *p_Var17;
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  pthread_t __target_thread;
  snapshot_sync_req *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  __node_base_ptr p_Var22;
  _Node *p_Var23;
  ulong uVar24;
  _List_node_base *p_Var25;
  _List_node_base *p_Var26;
  void **ppvVar27;
  iterator __position;
  __node_base_ptr p_Var28;
  pthread_mutex_t *__mutex;
  bool bVar29;
  bool is_last_request;
  unique_lock<std::recursive_mutex> guard_1;
  unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_> sync_req;
  string thread_name;
  unique_lock<std::mutex> lock;
  ptr<buffer> data;
  ptr<req_msg> req;
  ulong term;
  unique_lock<std::recursive_mutex> guard;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  reqs_to_return;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  reqs;
  bool local_15a;
  log_val_type local_159;
  long *local_158;
  uint local_14c;
  string local_148;
  undefined1 local_121;
  snapshot_sync_req *local_120;
  char *local_118 [2];
  char local_108 [16];
  undefined8 local_f8;
  ulong uStack_f0;
  undefined1 local_e8 [24];
  undefined1 local_d0;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_c8;
  ptr<req_msg> local_b8;
  unsigned_long local_a8;
  unique_lock<std::recursive_mutex> local_a0;
  _List_node_base local_90;
  long local_80;
  _List_node_base local_78;
  undefined8 local_68;
  ptr<peer> local_60;
  pthread_mutex_t *local_50;
  _func_int **local_48;
  _func_int **local_40;
  snapshot_io_mgr *local_38;
  
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"nuraft_snp_io","");
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,local_118[0]);
  __mutex = (pthread_mutex_t *)&this->queue_lock_;
  this_00 = &this->queue_;
  local_40 = (_func_int **)&PTR___Sp_counted_ptr_inplace_005bd0a0;
  local_48 = (_func_int **)&PTR__req_msg_005bd0f0;
  local_50 = __mutex;
  local_38 = this;
  do {
    EventAwaiter::wait_us
              ((this->io_thread_ea_).
               super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1000000);
    LOCK();
    (((this->io_thread_ea_).super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->status)._M_i = idle;
    UNLOCK();
    local_68 = 0;
    local_80 = 0;
    local_90._M_next = &local_90;
    local_90._M_prev = &local_90;
    local_78._M_next = &local_78;
    local_78._M_prev = &local_78;
    if (((this->terminating_)._M_base._M_i & 1U) == 0) {
      iVar19 = pthread_mutex_lock(__mutex);
      if (iVar19 != 0) {
        std::__throw_system_error(iVar19);
      }
      if (&local_78 != (_List_node_base *)this_00) {
        std::__cxx11::
        list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
        ::
        _M_assign_dispatch<std::_List_const_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                  ((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                    *)&local_78,
                   (this_00->
                   super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next,this_00);
      }
      pthread_mutex_unlock(__mutex);
    }
    p_Var25 = local_78._M_next;
    if (local_78._M_next != &local_78) {
      do {
        iVar19 = 4;
        if (((this->terminating_)._M_base._M_i & 1U) == 0) {
          p_Var26 = p_Var25 + 1;
          peVar5 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                      *)&p_Var26->_M_next)->_M_ptr->raft_).
                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (((peVar5->leader_).super___atomic_base<int>._M_i == peVar5->id_) &&
             ((peVar5->role_)._M_i == leader)) {
            peVar6 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                        *)&p_Var26->_M_next)->_M_ptr->dst_).
                     super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar3 = *(uint *)(peVar6->config_).
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
            local_e8._16_8_ = &peVar6->lock_;
            local_d0 = 0;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_e8 + 0x10));
            local_d0 = 1;
            peVar7 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                       *)&p_Var26->_M_next)->_M_ptr;
            peVar8 = (peVar7->sync_ctx_).
                     super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_158 = (long *)(((peVar7->raft_).
                                  super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->l_).
                                super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr;
            local_f8 = (peVar8->field_2).offset_;
            ppvVar27 = &peVar8->user_snp_ctx_;
            if ((local_158 != (long *)0x0) &&
               (iVar19 = (**(code **)(*local_158 + 0x38))(), 4 < iVar19)) {
              msg_if_given_abi_cxx11_
                        (&local_148,"peer: %d, obj_idx: %lu, user_snp_ctx %p",(ulong)uVar3,local_f8,
                         *ppvVar27);
              (**(code **)(*local_158 + 0x40))
                        (local_158,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                         ,"async_io_loop",0xb8,&local_148);
              if (local_148._M_dataplus._M_p != (pointer)((long)&local_148 + 0x10)) {
                operator_delete(local_148._M_dataplus._M_p);
              }
            }
            peVar9 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                        *)&p_Var26->_M_next)->_M_ptr->snapshot_).
                     super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar10 = peVar9->last_log_idx_;
            uVar11 = peVar9->last_log_term_;
            local_14c = uVar3;
            std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)(local_e8 + 0x10));
            local_c8._M_ptr = (element_type *)0x0;
            local_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_15a = false;
            peVar7 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                       *)&p_Var26->_M_next)->_M_ptr;
            plVar12 = (long *)(((peVar7->raft_).
                                super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->state_machine_).
                              super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
            iVar19 = (**(code **)(*plVar12 + 0x70))
                               (plVar12,(peVar7->snapshot_).
                                        super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,ppvVar27,local_f8,&local_c8,&local_15a);
            if (iVar19 < 0) {
              if (local_158 != (long *)0x0) {
                iVar20 = (**(code **)(*local_158 + 0x38))();
                if (2 < iVar20) {
                  msg_if_given_abi_cxx11_
                            (&local_148,
                             "reading snapshot (idx %lu, term %lu, object %lu) for peer %d failed: %d"
                             ,uVar10,uVar11,local_f8,(ulong)local_14c,iVar19);
                  (**(code **)(*local_158 + 0x40))
                            (local_158,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                             ,"async_io_loop",0xca,&local_148);
                  if (local_148._M_dataplus._M_p != (pointer)((long)&local_148 + 0x10)) {
                    operator_delete(local_148._M_dataplus._M_p);
                  }
                }
              }
              local_148._M_string_length._0_1_ = 0;
              local_148._M_dataplus._M_p =
                   (pointer)&((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                 *)&p_Var26->_M_next)->_M_ptr->raft_).
                              super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->lock_;
              std::unique_lock<std::recursive_mutex>::lock
                        ((unique_lock<std::recursive_mutex> *)&local_148);
              local_148._M_string_length._0_1_ = 1;
              peVar7 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                         *)&p_Var26->_M_next)->_M_ptr;
              prVar14 = (peVar7->raft_).
                        super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              uVar15 = (prVar14->peers_)._M_h._M_bucket_count;
              uVar24 = (ulong)(long)(int)local_14c % uVar15;
              p_Var16 = (prVar14->peers_)._M_h._M_buckets[uVar24];
              p_Var22 = (__node_base_ptr)0x0;
              if ((p_Var16 != (__node_base_ptr)0x0) &&
                 (p_Var22 = p_Var16, p_Var28 = p_Var16->_M_nxt,
                 local_14c != *(uint *)&p_Var16->_M_nxt[1]._M_nxt)) {
                while (p_Var17 = p_Var28->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
                  p_Var22 = (__node_base_ptr)0x0;
                  if (((ulong)(long)(int)*(uint *)&p_Var17[1]._M_nxt % uVar15 != uVar24) ||
                     (p_Var22 = p_Var28, p_Var28 = p_Var17, local_14c == *(uint *)&p_Var17[1]._M_nxt
                     )) goto LAB_001b591e;
                }
                p_Var22 = (__node_base_ptr)0x0;
              }
LAB_001b591e:
              if ((p_Var22 == (__node_base_ptr)0x0) || (p_Var22->_M_nxt == (_Hash_node_base *)0x0))
              {
                LOCK();
                (prVar14->srv_to_join_snp_retry_required_)._M_base._M_i = true;
                UNLOCK();
                prVar14 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                             *)&p_Var26->_M_next)->_M_ptr->raft_).
                          super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ;
                raft_server::enable_hb_for_peer
                          (prVar14,(prVar14->srv_to_join_).
                                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
              }
              else {
                raft_server::clear_snapshot_sync_ctx
                          (prVar14,(peVar7->dst_).
                                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)&local_148);
              iVar19 = 5;
            }
            else {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_ptr !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                buffer::pos(local_c8._M_ptr,0);
              }
              local_a0._M_device =
                   &((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                        *)&p_Var26->_M_next)->_M_ptr->raft_).
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    lock_;
              local_a0._M_owns = false;
              std::unique_lock<std::recursive_mutex>::lock(&local_a0);
              local_a0._M_owns = true;
              local_a8 = *(unsigned_long *)
                          ((long)(((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                      *)&p_Var26->_M_next)->_M_ptr->raft_).
                                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->state_).
                                 super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 8);
              _Var13._M_i = (((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                 *)&p_Var26->_M_next)->_M_ptr->raft_).
                              super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
              this_01 = (snapshot_sync_req *)operator_new(0x30);
              snapshot_sync_req::snapshot_sync_req
                        (this_01,&((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                    *)&p_Var26->_M_next)->_M_ptr->snapshot_,local_f8,
                         (ptr<buffer> *)&local_c8,local_15a);
              peVar7 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                         *)&p_Var26->_M_next)->_M_ptr;
              peVar5 = (peVar7->raft_).
                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              peVar9 = (peVar7->snapshot_).
                       super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_f8 = peVar9->last_log_idx_;
              uStack_f0 = peVar9->last_log_term_;
              local_b8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_120 = this_01;
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
              p_Var21->_M_use_count = 1;
              p_Var21->_M_weak_count = 1;
              p_Var21->_vptr__Sp_counted_base = local_40;
              local_b8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)(p_Var21 + 1);
              iVar4 = peVar5->id_;
              p_Var21[1]._M_use_count = (undefined4)local_a8;
              p_Var21[1]._M_weak_count = local_a8._4_4_;
              *(undefined4 *)&p_Var21[2]._vptr__Sp_counted_base = 0x10;
              *(int32 *)((long)&p_Var21[2]._vptr__Sp_counted_base + 4) = iVar4;
              p_Var21[2]._M_use_count = local_14c;
              p_Var21[1]._vptr__Sp_counted_base = local_48;
              *(undefined4 *)&p_Var21[3]._vptr__Sp_counted_base = (undefined4)uStack_f0;
              *(_Atomic_word *)((long)&p_Var21[3]._vptr__Sp_counted_base + 4) = local_f8._4_4_;
              p_Var21[3]._M_use_count = (_Atomic_word)local_f8;
              p_Var21[3]._M_weak_count = local_f8._4_4_;
              p_Var21[4]._vptr__Sp_counted_base = (_func_int **)_Var13._M_i;
              *(undefined1 (*) [16])&p_Var21[4]._M_use_count = (undefined1  [16])0x0;
              p_Var21[5]._M_use_count = 0;
              p_Var21[5]._M_weak_count = 0;
              local_b8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = p_Var21;
              snapshot_sync_req::serialize((snapshot_sync_req *)local_e8);
              local_159 = snp_sync_req;
              auVar18._8_8_ = 0;
              auVar18._0_8_ = local_148._M_string_length;
              local_148._0_16_ = auVar18 << 0x40;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long&,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_148 + 8),
                         (log_entry **)&local_148,(allocator<nuraft::log_entry> *)&local_121,
                         &local_a8,(shared_ptr<nuraft::buffer> *)local_e8,&local_159);
              std::
              vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
              ::emplace_back<std::shared_ptr<nuraft::log_entry>>
                        ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                          *)&p_Var21[4]._M_use_count,(shared_ptr<nuraft::log_entry> *)&local_148);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_148._M_string_length);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
              }
              paVar2 = &((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                            *)&p_Var26->_M_next)->_M_ptr->dst_).
                         super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        busy_flag_;
              LOCK();
              bVar29 = (paVar2->_M_base)._M_i == false;
              if (bVar29) {
                (paVar2->_M_base)._M_i = true;
              }
              UNLOCK();
              if (bVar29) {
                peVar6 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                            *)&p_Var26->_M_next)->_M_ptr->dst_).
                         super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_e8._0_8_ = (element_type *)0x0;
                local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_148.field_2 =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )0x0;
                local_148._0_16_ = (unique_lock<std::recursive_mutex>)0x0;
                (peVar6->rsv_msg_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&(peVar6->rsv_msg_).
                            super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8)
                          );
                std::
                function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                ::operator=(&peVar6->rsv_msg_handler_,
                            (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                             *)&local_148);
                if ((code *)local_148.field_2._M_allocated_capacity != (code *)0x0) {
                  (*(code *)local_148.field_2._M_allocated_capacity)(&local_148,&local_148,3);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
                }
                peVar7 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                           *)&p_Var26->_M_next)->_M_ptr;
                local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (peVar7->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
                local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (peVar7->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
                if (local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                peer::send_req(local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&local_60,&local_b8,
                               &((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                  *)&p_Var26->_M_next)->_M_ptr->handler_);
                if (local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_60.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                timer_helper::reset(&((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                         *)&p_Var26->_M_next)->_M_ptr->dst_).
                                      super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->last_sent_timer_);
                if ((local_158 != (long *)0x0) &&
                   (iVar19 = (**(code **)(*local_158 + 0x38))(), 5 < iVar19)) {
                  msg_if_given_abi_cxx11_
                            (&local_148,"bg thread sent message to peer %d",(ulong)local_14c);
                  (**(code **)(*local_158 + 0x40))
                            (local_158,6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                             ,"async_io_loop",0xf5,&local_148);
                  if (local_148._M_dataplus._M_p != (pointer)((long)&local_148 + 0x10)) {
                    operator_delete(local_148._M_dataplus._M_p);
                  }
                }
              }
              else {
                if ((local_158 != (long *)0x0) &&
                   (iVar19 = (**(code **)(*local_158 + 0x38))(), 4 < iVar19)) {
                  msg_if_given_abi_cxx11_
                            (&local_148,"peer %d is busy, push the request back to queue",
                             (ulong)local_14c);
                  (**(code **)(*local_158 + 0x40))
                            (local_158,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                             ,"async_io_loop",0xf8,&local_148);
                  if (local_148._M_dataplus._M_p != (pointer)((long)&local_148 + 0x10)) {
                    operator_delete(local_148._M_dataplus._M_p);
                  }
                }
                p_Var23 = std::__cxx11::
                          list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                          ::
                          _M_create_node<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>const&>
                                    ((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                                      *)&local_90,
                                     (shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *)p_Var26);
                std::__detail::_List_node_base::_M_hook(&p_Var23->super__List_node_base);
                local_80 = local_80 + 1;
              }
              if (local_b8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_b8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_120 != (snapshot_sync_req *)0x0) {
                std::default_delete<nuraft::snapshot_sync_req>::operator()
                          ((default_delete<nuraft::snapshot_sync_req> *)&local_120,local_120);
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock(&local_a0);
              iVar19 = 0;
            }
            if (local_c8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8._M_refcount._M_pi);
            }
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_e8 + 0x10))
            ;
          }
        }
        this = local_38;
      } while (((iVar19 == 5) || (iVar19 == 0)) &&
              (p_Var25 = p_Var25->_M_next, p_Var25 != &local_78));
    }
    __mutex = local_50;
    iVar19 = pthread_mutex_lock(local_50);
    if (iVar19 != 0) {
      std::__throw_system_error(iVar19);
    }
    p_Var26 = local_90._M_next;
    for (p_Var25 = local_78._M_next; __position._M_node = (_List_node_base *)this_00,
        local_90._M_next = p_Var26, p_Var25 != &local_78;
        p_Var25 = (((_List_impl *)&p_Var25->_M_next)->_M_node).super__List_node_base._M_next) {
      do {
        __position._M_node = (__position._M_node)->_M_next;
        if (__position._M_node == (_List_node_base *)this_00) goto LAB_001b59f1;
      } while (__position._M_node[1]._M_next != p_Var25[1]._M_next);
      std::__cxx11::
      list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
      ::_M_erase(this_00,__position);
LAB_001b59f1:
      p_Var26 = local_90._M_next;
    }
    for (; p_Var26 != &local_90;
        p_Var26 = (((_List_impl *)&p_Var26->_M_next)->_M_node).super__List_node_base._M_next) {
      p_Var23 = std::__cxx11::
                list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                ::_M_create_node<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>const&>
                          ((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                            *)this_00,
                           (shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *)(p_Var26 + 1));
      std::__detail::_List_node_base::_M_hook(&p_Var23->super__List_node_base);
      psVar1 = &(this->queue_).
                super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    pthread_mutex_unlock(__mutex);
    std::__cxx11::
    _List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::_M_clear((_List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)&local_90);
    std::__cxx11::
    _List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::_M_clear((_List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)&local_78);
    if (((this->terminating_)._M_base._M_i & 1U) != 0) {
      if (local_118[0] != local_108) {
        operator_delete(local_118[0]);
      }
      return;
    }
  } while( true );
}

Assistant:

void snapshot_io_mgr::async_io_loop() {
    std::string thread_name = "nuraft_snp_io";
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    do {
        io_thread_ea_->wait_ms(1000);
        io_thread_ea_->reset();

        std::list< ptr<io_queue_elem> > reqs;
        std::list< ptr<io_queue_elem> > reqs_to_return;
        if (!terminating_) {
            auto_lock(queue_lock_);
            reqs = queue_;
        }

        for (ptr<io_queue_elem>& elem: reqs) {
            if (terminating_) {
                break;
            }
            if (!elem->raft_->is_leader()) {
                break;
            }

            int dst_id = elem->dst_->get_id();

            std::unique_lock<std::mutex> lock(elem->dst_->get_lock());
            // ---- lock acquired
            logger* l_ = elem->raft_->l_.get();
            ulong obj_idx = elem->sync_ctx_->get_offset();
            void*& user_snp_ctx = elem->sync_ctx_->get_user_snp_ctx();
            p_db("peer: %d, obj_idx: %" PRIu64 ", user_snp_ctx %p",
                 dst_id, obj_idx, user_snp_ctx);

            ulong snp_log_idx = elem->snapshot_->get_last_log_idx();
            ulong snp_log_term = elem->snapshot_->get_last_log_term();
            // ---- lock released
            lock.unlock();

            ptr<buffer> data = nullptr;
            bool is_last_request = false;

            int rc = elem->raft_->state_machine_->read_logical_snp_obj
                     ( *elem->snapshot_, user_snp_ctx, obj_idx,
                       data, is_last_request );
            if (rc < 0) {
                // Snapshot read failed.
                p_wn( "reading snapshot (idx %" PRIu64 ", term %" PRIu64
                      ", object %" PRIu64 ") "
                      "for peer %d failed: %d",
                      snp_log_idx, snp_log_term, obj_idx, dst_id, rc );

                recur_lock(elem->raft_->lock_);
                auto entry = elem->raft_->peers_.find(dst_id);
                if (entry != elem->raft_->peers_.end()) {
                    // If normal member (already in the peer list):
                    //   reset the `sync_ctx` so as to retry with the newer version.
                    elem->raft_->clear_snapshot_sync_ctx(*elem->dst_);
                } else {
                    // If it is joing the server (not in the peer list),
                    // enable HB temporarily to retry the request.
                    elem->raft_->srv_to_join_snp_retry_required_ = true;
                    elem->raft_->enable_hb_for_peer(*elem->raft_->srv_to_join_);
                }

                continue;
            }
            if (data) data->pos(0);

            // Send snapshot message with the given response handler.
            recur_lock(elem->raft_->lock_);
            ulong term = elem->raft_->state_->get_term();
            ulong commit_idx = elem->raft_->quick_commit_index_;

            std::unique_ptr<snapshot_sync_req> sync_req(
                new snapshot_sync_req( elem->snapshot_, obj_idx,
                                       data, is_last_request ) );
            ptr<req_msg> req( cs_new<req_msg>
                              ( term,
                                msg_type::install_snapshot_request,
                                elem->raft_->id_,
                                dst_id,
                                elem->snapshot_->get_last_log_term(),
                                elem->snapshot_->get_last_log_idx(),
                                commit_idx ) );
            req->log_entries().push_back( cs_new<log_entry>
                                          ( term,
                                            sync_req->serialize(),
                                            log_val_type::snp_sync_req ) );
            if (elem->dst_->make_busy()) {
                elem->dst_->set_rsv_msg(nullptr, nullptr);
                elem->dst_->send_req(elem->dst_, req, elem->handler_);
                elem->dst_->reset_ls_timer();
                p_tr("bg thread sent message to peer %d", dst_id);

            } else {
                p_db("peer %d is busy, push the request back to queue", dst_id);
                reqs_to_return.push_back(elem);
            }
        }

        {
            auto_lock(queue_lock_);
            // Remove elements in `reqs` from `queue_`.
            for (auto& entry: reqs) {
                auto e2 = queue_.begin();
                while (e2 != queue_.end()) {
                    if (*e2 == entry) {
                        e2 = queue_.erase(e2);
                        break;
                    } else {
                        e2++;
                    }
                }
            }
            // Return elements in `reqs_to_return` to `queue_` for retrying.
            for (auto& entry: reqs_to_return) {
                queue_.push_back(entry);
            }
        }

    } while (!terminating_);
}